

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extra_type_info.cpp
# Opt level: O2

void __thiscall duckdb::ExtraTypeInfo::ExtraTypeInfo(ExtraTypeInfo *this,ExtraTypeInfo *other)

{
  _Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false> __p;
  type args;
  _Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false> local_20;
  
  this->_vptr_ExtraTypeInfo = (_func_int **)&PTR__ExtraTypeInfo_027a6ac0;
  this->type = other->type;
  ::std::__cxx11::string::string((string *)&this->alias,(string *)&other->alias);
  (this->extension_info).
  super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
  .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl = (ExtensionTypeInfo *)0x0
  ;
  if ((other->extension_info).
      super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
      .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl !=
      (ExtensionTypeInfo *)0x0) {
    args = unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
           ::operator*(&other->extension_info);
    make_uniq<duckdb::ExtensionTypeInfo,duckdb::ExtensionTypeInfo&>((duckdb *)&local_20,args);
    __p._M_head_impl = local_20._M_head_impl;
    local_20._M_head_impl = (ExtensionTypeInfo *)0x0;
    std::__uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
    ::reset((__uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
             *)&this->extension_info,__p._M_head_impl);
    ::std::unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>::
    ~unique_ptr((unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                 *)&local_20);
  }
  return;
}

Assistant:

ExtraTypeInfo::ExtraTypeInfo(const ExtraTypeInfo &other) : type(other.type), alias(other.alias) {
	if (other.extension_info) {
		extension_info = make_uniq<ExtensionTypeInfo>(*other.extension_info);
	}
}